

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::AddNodePrefixesChecked
               (aiNode *node,char *prefix,uint len,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  bool local_59;
  uint local_4c;
  iterator iStack_48;
  uint i_1;
  _Self local_40;
  uint local_34;
  uint32_t local_30;
  uint i;
  uint hash;
  uint cur_local;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input_local;
  char *pcStack_18;
  uint len_local;
  char *prefix_local;
  aiNode *node_local;
  
  i = cur;
  _hash = input;
  input_local._4_4_ = len;
  pcStack_18 = prefix;
  prefix_local = (char *)node;
  local_30 = SuperFastHash((node->mName).data,(node->mName).length,0);
  local_34 = 0;
  do {
    uVar1 = (ulong)local_34;
    sVar2 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size(_hash);
    if (sVar2 <= uVar1) {
LAB_002385d2:
      for (local_4c = 0; local_4c < *(uint *)(prefix_local + 0x450); local_4c = local_4c + 1) {
        AddNodePrefixesChecked
                  (*(aiNode **)(*(long *)(prefix_local + 0x458) + (ulong)local_4c * 8),pcStack_18,
                   input_local._4_4_,_hash,i);
      }
      return;
    }
    local_59 = false;
    if (i != local_34) {
      pvVar3 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                         (_hash,(ulong)local_34);
      local_40._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     (&pvVar3->hashes,&local_30);
      pvVar3 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                         (_hash,(ulong)local_34);
      iStack_48 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end(&pvVar3->hashes);
      local_59 = std::operator!=(&local_40,&stack0xffffffffffffffb8);
    }
    if (local_59 != false) {
      PrefixString((aiString *)prefix_local,pcStack_18,input_local._4_4_);
      goto LAB_002385d2;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void SceneCombiner::AddNodePrefixesChecked(aiNode* node, const char* prefix, unsigned int len,
        std::vector<SceneHelper>& input, unsigned int cur) {
    ai_assert(NULL != prefix);
    const unsigned int hash = SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            PrefixString(node->mName,prefix,len);
            break;
        }
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodePrefixesChecked(node->mChildren[i],prefix,len,input,cur);
}